

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  int _w;
  Mat *in_RSI;
  long in_RDI;
  int len;
  bool is_array;
  int id;
  ParamDict *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  clear(in_stack_00000030);
  _w = *in_RSI->data;
  in_RSI->data = (void *)((long)in_RSI->data + 4);
  while (_w != -0xe9) {
    if (_w < -0x5b03) {
      _w = -0x5b04 - _w;
      iVar1 = *in_RSI->data;
      in_RSI->data = (void *)((long)in_RSI->data + 4);
      Mat::create(in_RSI,_w,CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      memcpy(*(void **)(in_RDI + (long)_w * 0x38 + 8),in_RSI->data,(long)(iVar1 << 2));
      in_RSI->data = (void *)((long)in_RSI->data + (long)(iVar1 << 2));
    }
    else {
      *(undefined4 *)(in_RDI + (long)_w * 0x38 + 4) = *in_RSI->data;
      in_RSI->data = (void *)((long)in_RSI->data + 4);
    }
    *(undefined4 *)(in_RDI + (long)_w * 0x38) = 1;
    _w = *in_RSI->data;
    in_RSI->data = (void *)((long)in_RSI->data + 4);
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}